

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::vector<double,_std::allocator<double>_>_>::setData
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *pval)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  Parameter<std::vector<double,_std::allocator<double>_>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  std::vector<double,_std::allocator<double>_>::vector(in_stack_00000010,in_stack_00000008);
  bVar1 = Parameter<std::vector<double,std::allocator<double>>>::
          internalSetData<std::vector<double,std::allocator<double>>>
                    (in_stack_00000020,in_stack_00000018);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

virtual bool setData(std::vector<RealType> pval) {
    return internalSetData<std::vector<RealType>>(pval);
  }